

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O2

bool __thiscall miniply::PLYReader::load_ascii_list_property(PLYReader *this,PLYProperty *prop)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  int count;
  uint local_44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  uint local_34;
  
  local_44 = 0;
  if ((((int)prop->countType < 6) && (bVar2 = int_literal(this,(int *)&local_44), bVar2)) &&
     (bVar2 = advance(this), bVar2)) {
    uVar3 = 0;
    this->m_valid = -1 < (int)local_44;
    if (-1 < (int)local_44) {
      uVar1 = *(uint *)(kPLYPropertySize + (ulong)prop->type * 4);
      lVar4 = (long)(prop->listData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(prop->listData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_40 = &prop->listData;
      local_34 = local_44;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&prop->rowCount,&local_34);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (local_40,(long)(int)local_44 * (ulong)uVar1 + lVar4);
      for (; uVar3 < local_44; uVar3 = uVar3 + 1) {
        bVar2 = ascii_value(this,prop->type,
                            (prop->listData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar4);
        if (!bVar2) goto LAB_00105277;
        lVar4 = lVar4 + (ulong)uVar1;
      }
      uVar3 = 1;
    }
  }
  else {
LAB_00105277:
    this->m_valid = false;
    uVar3 = 0;
  }
  return SUB41(uVar3,0);
}

Assistant:

bool PLYReader::load_ascii_list_property(PLYProperty& prop)
  {
    int count = 0;
    m_valid = (prop.countType < PLYPropertyType::Float) && int_literal(&count) && advance() && (count >= 0);
    if (!m_valid) {
      return false;
    }

    const size_t numBytes = kPLYPropertySize[uint32_t(prop.type)];

    size_t back = prop.listData.size();
    prop.rowCount.push_back(static_cast<uint32_t>(count));
    prop.listData.resize(back + numBytes * size_t(count));

    for (uint32_t i = 0; i < uint32_t(count); i++) {
      if (!ascii_value(prop.type, prop.listData.data() + back)) {
        m_valid = false;
        return false;
      }
      back += numBytes;
    }

    return true;
  }